

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entities.c
# Opt level: O2

int xmlSerializeDecCharRef(char *buf,int val)

{
  ulong uVar1;
  int iVar2;
  uint uVar3;
  char *out;
  ulong uVar4;
  bool bVar5;
  
  uVar1 = (ulong)(uint)val;
  buf[0] = '&';
  buf[1] = '#';
  if (val < 100) {
    uVar3 = (9 < val) + 1;
  }
  else {
    if ((uint)val < 10000) {
      bVar5 = (uint)val < 1000;
      iVar2 = 4;
    }
    else {
      if (999999 < (uint)val) {
        uVar3 = 7;
        goto LAB_0012e6eb;
      }
      bVar5 = (uint)val < 100000;
      iVar2 = 6;
    }
    uVar3 = iVar2 - (uint)bVar5;
  }
LAB_0012e6eb:
  for (uVar4 = (ulong)uVar3; iVar2 = (int)uVar1, 0 < (long)uVar4; uVar4 = uVar4 - 1) {
    uVar1 = (long)iVar2 / 10;
    buf[uVar4 + 1] = (char)(iVar2 % 10) + '0';
  }
  buf[(ulong)uVar3 + 2] = ';';
  return uVar3 + 3;
}

Assistant:

int
xmlSerializeDecCharRef(char *buf, int val) {
    char *out = buf;
    int len, i;

    *out++ = '&';
    *out++ = '#';

    if (val < 100) {
        len = (val < 10) ? 1 : 2;
    } else if (val < 10000) {
        len = (val < 1000) ? 3 : 4;
    } else if (val < 1000000) {
        len = (val < 100000) ? 5 : 6;
    } else {
        len = 7;
    }

    for (i = len - 1; i >= 0; i--) {
        out[i] = '0' + val % 10;
        val /= 10;
    }

    out[len] = ';';

    return(len + 3);
}